

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

void __thiscall gutil::Properties::load(Properties *this,istream *in,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long lVar3;
  IOException *pIVar4;
  string key;
  string line;
  string value;
  string local_d8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  lVar3 = *(long *)(*(long *)in + -0x18);
  *(undefined4 *)(in + lVar3 + 0x1c) = 1;
  local_b8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this;
  std::ios::clear((int)in + (int)lVar3);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (*(int *)(in + lVar3 + 0x20) != 0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,(allocator *)&local_d8);
    IOException::IOException(pIVar4,&local_b0.first);
    __cxa_throw(pIVar4,&IOException::typeinfo,Exception::~Exception);
  }
  paVar1 = &local_b0.first.field_2;
  do {
    cVar2 = std::ios::widen((char)lVar3 + (char)in);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&local_70,cVar2);
    trim(&local_70);
    cVar2 = (char)&local_70;
    lVar3 = std::__cxx11::string::find(cVar2,0x23);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.first._M_dataplus._M_p);
      }
    }
    if (local_70._M_string_length != 0) {
      lVar3 = std::__cxx11::string::find(cVar2,0x3d);
      if (lVar3 == -1) {
        pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
        std::operator+(&local_b0.first,"Format <key>=<value> expected: ",&local_70);
        IOException::IOException(pIVar4,&local_b0.first);
        __cxa_throw(pIVar4,&IOException::typeinfo,Exception::~Exception);
      }
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_70);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      trim(&local_d8);
      trim(&local_50);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_b0,&local_d8,&local_50);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_b8,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
        operator_delete(local_b0.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    lVar3 = *(long *)(*(long *)in + -0x18);
  } while (*(int *)(in + lVar3 + 0x20) == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Properties::load(std::istream &in, const char *name)
{
  std::string line;

  try
  {
    in.exceptions(std::ios_base::badbit);

    if (!in.good())
    {
      throw IOException(name);
    }

    while (in.good())
    {
      getline(in, line);

      trim(line);

      size_t pos=line.find('#');

      if (pos != line.npos)
      {
        line=line.substr(0, pos);
      }

      if (line.size() > 0)
      {
        pos=line.find('=');

        if (pos != line.npos)
        {
          std::string key=line.substr(0, pos);
          std::string value=line.substr(pos+1);

          trim(key);
          trim(value);

          data.insert(std::pair<std::string,std::string>(key, value));
        }
        else
        {
          throw IOException("Format <key>=<value> expected: "+line);
        }
      }
    }
  }
  catch (const std::ios_base::failure &ex)
  {
    throw IOException(ex.what());
  }
}